

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  Curl_hash *pCVar1;
  Curl_hash_element *he;
  int i;
  Curl_hash *h;
  Curl_hash_iterator *iter_local;
  
  pCVar1 = iter->hash;
  if (pCVar1->table == (Curl_llist *)0x0) {
    iter_local = (Curl_hash_iterator *)0x0;
  }
  else {
    if (iter->current_element != (Curl_llist_element *)0x0) {
      iter->current_element = iter->current_element->next;
    }
    if (iter->current_element == (Curl_llist_element *)0x0) {
      for (he._4_4_ = iter->slot_index; he._4_4_ < pCVar1->slots; he._4_4_ = he._4_4_ + 1) {
        if (pCVar1->table[he._4_4_].head != (Curl_llist_element *)0x0) {
          iter->current_element = pCVar1->table[he._4_4_].head;
          iter->slot_index = he._4_4_ + 1;
          break;
        }
      }
    }
    if (iter->current_element == (Curl_llist_element *)0x0) {
      iter->current_element = (Curl_llist_element *)0x0;
      iter_local = (Curl_hash_iterator *)0x0;
    }
    else {
      iter_local = (Curl_hash_iterator *)iter->current_element->ptr;
    }
  }
  return (Curl_hash_element *)iter_local;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h = iter->hash;

  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    int i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(h->table[i].head) {
        iter->current_element = h->table[i].head;
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  iter->current_element = NULL;
  return NULL;
}